

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_compressBlock_greedy
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  ulong *ilimit_w;
  ulong *puVar4;
  BYTE *pBVar5;
  undefined8 *puVar6;
  uint uVar7;
  uint uVar8;
  U32 UVar9;
  uint uVar10;
  U32 *pUVar11;
  undefined8 uVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  seqDef *psVar16;
  uint uVar17;
  BYTE *pBVar18;
  ulong *puVar19;
  ulong uVar20;
  int iVar21;
  long lVar22;
  ulong *puVar23;
  BYTE *pInLoopLimit;
  ulong *puVar24;
  BYTE *pBVar25;
  uint uVar26;
  long lVar27;
  uint uVar28;
  uint uVar29;
  U32 UVar30;
  ulong uVar31;
  ulong *puVar32;
  ulong uVar33;
  BYTE *litEnd;
  U32 UVar34;
  uint uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong *puVar39;
  BYTE *litLimit_w;
  uint local_ac;
  uint local_8c;
  
  puVar4 = (ulong *)((long)src + srcSize);
  pBVar18 = (ms->window).base + (ms->window).dictLimit;
  uVar7 = rep[1];
  puVar24 = (ulong *)((ulong)((int)src == (int)pBVar18) + (long)src);
  uVar26 = (int)puVar24 - (int)pBVar18;
  uVar36 = (ulong)uVar7;
  if (uVar26 < uVar7) {
    uVar36 = 0;
  }
  uVar28 = (uint)uVar36;
  puVar32 = (ulong *)((long)src + (srcSize - 8));
  uVar8 = *rep;
  uVar31 = (ulong)uVar8;
  if (uVar26 < uVar8) {
    uVar31 = 0;
  }
  uVar15 = (uint)uVar31;
  if (puVar32 <= puVar24) {
LAB_001173c1:
    uVar14 = 0;
    if (uVar26 < uVar7) {
      uVar14 = uVar7;
    }
    if (uVar26 < uVar8) {
      uVar14 = uVar8;
    }
    if (uVar15 == 0) {
      uVar15 = uVar14;
    }
    if (uVar28 != 0) {
      uVar14 = uVar28;
    }
    *rep = uVar15;
    rep[1] = uVar14;
    return (long)puVar4 - (long)src;
  }
  puVar1 = (ulong *)((long)puVar4 - 7);
  puVar2 = (ulong *)((long)puVar4 - 3);
  puVar3 = (ulong *)((long)puVar4 - 1);
  ilimit_w = puVar4 + -4;
LAB_0011682a:
  uVar28 = (uint)uVar31;
  local_8c = (uint)uVar36;
  local_ac = uVar28;
  if ((uVar28 == 0) || (*(int *)(((long)puVar24 + 1) - uVar31) != *(int *)((long)puVar24 + 1))) {
    uVar15 = (ms->cParams).minMatch;
    UVar30 = (U32)puVar24;
    if (uVar15 - 6 < 2) {
      uVar15 = (ms->cParams).chainLog;
      uVar29 = 1 << ((byte)uVar15 & 0x1f);
      pBVar25 = (ms->window).base;
      uVar35 = UVar30 - (int)pBVar25;
      uVar14 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
      UVar9 = (ms->window).lowLimit;
      UVar34 = uVar35 - uVar14;
      if (uVar35 - UVar9 <= uVar14) {
        UVar34 = UVar9;
      }
      pUVar11 = ms->chainTable;
      uVar14 = (ms->window).dictLimit;
      if (ms->loadedDictEnd != 0) {
        UVar34 = UVar9;
      }
      uVar17 = uVar35 - uVar29;
      if (uVar35 < uVar29) {
        uVar17 = 0;
      }
      uVar10 = (ms->cParams).searchLog;
      uVar15 = ZSTD_insertAndFindFirstIndex_internal
                         (ms,(ZSTD_compressionParameters *)(ulong)uVar15,
                          (BYTE *)(ulong)(ms->cParams).hashLog,UVar30);
      if (UVar34 < uVar15) {
        iVar21 = 1 << ((byte)uVar10 & 0x1f);
        uVar20 = 999999999;
        uVar37 = 3;
        do {
          if (uVar15 < uVar14) {
LAB_00117478:
            __assert_fail("matchIndex >= dictLimit",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x40d8,
                          "size_t ZSTD_HcFindBestMatch_generic(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, size_t *, const U32, const ZSTD_dictMode_e)"
                         );
          }
          puVar39 = (ulong *)(pBVar25 + uVar15);
          if (*(char *)((long)puVar39 + uVar37) == *(char *)((long)puVar24 + uVar37)) {
            puVar23 = puVar24;
            if (puVar24 < puVar1) {
              if (*puVar39 == *puVar24) {
                lVar22 = (ulong)uVar15 + 8;
                lVar27 = 0;
                do {
                  puVar23 = (ulong *)((long)puVar24 + lVar27 + 8);
                  if (puVar1 <= puVar23) {
                    puVar39 = (ulong *)(pBVar25 + lVar27 + lVar22);
                    goto LAB_00116a45;
                  }
                  lVar13 = lVar27 + lVar22;
                  lVar27 = lVar27 + 8;
                } while (*(ulong *)(pBVar25 + lVar13) == *puVar23);
                uVar33 = *puVar23 ^ *(ulong *)(pBVar25 + lVar13);
                uVar38 = 0;
                if (uVar33 != 0) {
                  for (; (uVar33 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
                  }
                }
                uVar38 = (uVar38 >> 3 & 0x1fffffff) + lVar27;
              }
              else {
                uVar33 = *puVar24 ^ *puVar39;
                uVar38 = 0;
                if (uVar33 != 0) {
                  for (; (uVar33 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
                  }
                }
                uVar38 = uVar38 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_00116a45:
              if ((puVar23 < puVar2) && ((int)*puVar39 == (int)*puVar23)) {
                puVar23 = (ulong *)((long)puVar23 + 4);
                puVar39 = (ulong *)((long)puVar39 + 4);
              }
              if ((puVar23 < puVar3) && ((short)*puVar39 == (short)*puVar23)) {
                puVar23 = (ulong *)((long)puVar23 + 2);
                puVar39 = (ulong *)((long)puVar39 + 2);
              }
              if (puVar23 < puVar4) {
                puVar23 = (ulong *)((long)puVar23 + (ulong)((char)*puVar39 == (char)*puVar23));
              }
              uVar38 = (long)puVar23 - (long)puVar24;
            }
            if ((uVar37 < uVar38) &&
               (uVar20 = (ulong)((uVar35 + 2) - uVar15), uVar37 = uVar38,
               (ulong *)(uVar38 + (long)puVar24) == puVar4)) goto LAB_00116efb;
          }
          if ((uVar15 <= uVar17) ||
             ((uVar15 = pUVar11[uVar15 & uVar29 - 1], uVar15 <= UVar34 ||
              (iVar21 = iVar21 + -1, iVar21 == 0)))) goto LAB_00116efb;
        } while( true );
      }
    }
    else if (uVar15 == 5) {
      uVar15 = (ms->cParams).chainLog;
      uVar29 = 1 << ((byte)uVar15 & 0x1f);
      pBVar25 = (ms->window).base;
      uVar35 = UVar30 - (int)pBVar25;
      uVar14 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
      UVar9 = (ms->window).lowLimit;
      UVar34 = uVar35 - uVar14;
      if (uVar35 - UVar9 <= uVar14) {
        UVar34 = UVar9;
      }
      pUVar11 = ms->chainTable;
      uVar14 = (ms->window).dictLimit;
      if (ms->loadedDictEnd != 0) {
        UVar34 = UVar9;
      }
      uVar17 = uVar35 - uVar29;
      if (uVar35 < uVar29) {
        uVar17 = 0;
      }
      uVar10 = (ms->cParams).searchLog;
      uVar15 = ZSTD_insertAndFindFirstIndex_internal
                         (ms,(ZSTD_compressionParameters *)(ulong)uVar15,
                          (BYTE *)(ulong)(ms->cParams).hashLog,UVar30);
      if (UVar34 < uVar15) {
        iVar21 = 1 << ((byte)uVar10 & 0x1f);
        uVar20 = 999999999;
        uVar37 = 3;
        do {
          if (uVar15 < uVar14) goto LAB_00117478;
          puVar39 = (ulong *)(pBVar25 + uVar15);
          if (*(char *)((long)puVar39 + uVar37) == *(char *)((long)puVar24 + uVar37)) {
            puVar23 = puVar24;
            if (puVar24 < puVar1) {
              if (*puVar39 == *puVar24) {
                lVar22 = (ulong)uVar15 + 8;
                lVar27 = 0;
                do {
                  puVar23 = (ulong *)((long)puVar24 + lVar27 + 8);
                  if (puVar1 <= puVar23) {
                    puVar39 = (ulong *)(pBVar25 + lVar27 + lVar22);
                    goto LAB_00116c5c;
                  }
                  lVar13 = lVar27 + lVar22;
                  lVar27 = lVar27 + 8;
                } while (*(ulong *)(pBVar25 + lVar13) == *puVar23);
                uVar33 = *puVar23 ^ *(ulong *)(pBVar25 + lVar13);
                uVar38 = 0;
                if (uVar33 != 0) {
                  for (; (uVar33 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
                  }
                }
                uVar38 = (uVar38 >> 3 & 0x1fffffff) + lVar27;
              }
              else {
                uVar33 = *puVar24 ^ *puVar39;
                uVar38 = 0;
                if (uVar33 != 0) {
                  for (; (uVar33 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
                  }
                }
                uVar38 = uVar38 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_00116c5c:
              if ((puVar23 < puVar2) && ((int)*puVar39 == (int)*puVar23)) {
                puVar23 = (ulong *)((long)puVar23 + 4);
                puVar39 = (ulong *)((long)puVar39 + 4);
              }
              if ((puVar23 < puVar3) && ((short)*puVar39 == (short)*puVar23)) {
                puVar23 = (ulong *)((long)puVar23 + 2);
                puVar39 = (ulong *)((long)puVar39 + 2);
              }
              if (puVar23 < puVar4) {
                puVar23 = (ulong *)((long)puVar23 + (ulong)((char)*puVar39 == (char)*puVar23));
              }
              uVar38 = (long)puVar23 - (long)puVar24;
            }
            if ((uVar37 < uVar38) &&
               (uVar20 = (ulong)((uVar35 + 2) - uVar15), uVar37 = uVar38,
               (ulong *)(uVar38 + (long)puVar24) == puVar4)) goto LAB_00116efb;
          }
          if ((uVar15 <= uVar17) ||
             ((uVar15 = pUVar11[uVar15 & uVar29 - 1], uVar15 <= UVar34 ||
              (iVar21 = iVar21 + -1, iVar21 == 0)))) goto LAB_00116efb;
        } while( true );
      }
    }
    else {
      uVar15 = (ms->cParams).chainLog;
      uVar29 = 1 << ((byte)uVar15 & 0x1f);
      pBVar25 = (ms->window).base;
      uVar35 = UVar30 - (int)pBVar25;
      uVar14 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
      UVar9 = (ms->window).lowLimit;
      UVar34 = uVar35 - uVar14;
      if (uVar35 - UVar9 <= uVar14) {
        UVar34 = UVar9;
      }
      pUVar11 = ms->chainTable;
      uVar14 = (ms->window).dictLimit;
      if (ms->loadedDictEnd != 0) {
        UVar34 = UVar9;
      }
      uVar17 = uVar35 - uVar29;
      if (uVar35 < uVar29) {
        uVar17 = 0;
      }
      uVar10 = (ms->cParams).searchLog;
      uVar15 = ZSTD_insertAndFindFirstIndex_internal
                         (ms,(ZSTD_compressionParameters *)(ulong)uVar15,
                          (BYTE *)(ulong)(ms->cParams).hashLog,UVar30);
      if (UVar34 < uVar15) {
        iVar21 = 1 << ((byte)uVar10 & 0x1f);
        uVar20 = 999999999;
        uVar37 = 3;
        do {
          if (uVar15 < uVar14) goto LAB_00117478;
          puVar39 = (ulong *)(pBVar25 + uVar15);
          if (*(char *)((long)puVar39 + uVar37) == *(char *)((long)puVar24 + uVar37)) {
            puVar23 = puVar24;
            if (puVar24 < puVar1) {
              if (*puVar39 == *puVar24) {
                lVar22 = (ulong)uVar15 + 8;
                lVar27 = 0;
                do {
                  puVar23 = (ulong *)((long)puVar24 + lVar27 + 8);
                  if (puVar1 <= puVar23) {
                    puVar39 = (ulong *)(pBVar25 + lVar27 + lVar22);
                    goto LAB_00116e72;
                  }
                  lVar13 = lVar27 + lVar22;
                  lVar27 = lVar27 + 8;
                } while (*(ulong *)(pBVar25 + lVar13) == *puVar23);
                uVar33 = *puVar23 ^ *(ulong *)(pBVar25 + lVar13);
                uVar38 = 0;
                if (uVar33 != 0) {
                  for (; (uVar33 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
                  }
                }
                uVar38 = (uVar38 >> 3 & 0x1fffffff) + lVar27;
              }
              else {
                uVar33 = *puVar24 ^ *puVar39;
                uVar38 = 0;
                if (uVar33 != 0) {
                  for (; (uVar33 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
                  }
                }
                uVar38 = uVar38 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_00116e72:
              if ((puVar23 < puVar2) && ((int)*puVar39 == (int)*puVar23)) {
                puVar23 = (ulong *)((long)puVar23 + 4);
                puVar39 = (ulong *)((long)puVar39 + 4);
              }
              if ((puVar23 < puVar3) && ((short)*puVar39 == (short)*puVar23)) {
                puVar23 = (ulong *)((long)puVar23 + 2);
                puVar39 = (ulong *)((long)puVar39 + 2);
              }
              if (puVar23 < puVar4) {
                puVar23 = (ulong *)((long)puVar23 + (ulong)((char)*puVar39 == (char)*puVar23));
              }
              uVar38 = (long)puVar23 - (long)puVar24;
            }
            if ((uVar37 < uVar38) &&
               (uVar20 = (ulong)((uVar35 + 2) - uVar15), uVar37 = uVar38,
               (ulong *)(uVar38 + (long)puVar24) == puVar4)) goto LAB_00116efb;
          }
          if ((uVar15 <= uVar17) ||
             ((uVar15 = pUVar11[uVar15 & uVar29 - 1], uVar15 <= UVar34 ||
              (iVar21 = iVar21 + -1, iVar21 == 0)))) goto LAB_00116efb;
        } while( true );
      }
    }
    goto LAB_00116f01;
  }
  lVar22 = -uVar31;
  puVar39 = (ulong *)((long)puVar24 + 5);
  puVar19 = (ulong *)((long)puVar24 + lVar22 + 5);
  puVar23 = puVar39;
  if (puVar39 < puVar1) {
    if (*puVar19 == *puVar39) {
      lVar27 = 0;
      do {
        puVar23 = (ulong *)((long)puVar24 + lVar27 + 0xd);
        if (puVar1 <= puVar23) {
          puVar19 = (ulong *)((long)puVar24 + lVar22 + lVar27 + 0xd);
          puVar23 = (ulong *)((long)puVar24 + lVar27 + 0xd);
          goto LAB_00116fab;
        }
        uVar36 = *(ulong *)((long)puVar24 + lVar27 + lVar22 + 0xd);
        uVar31 = *puVar23;
        lVar27 = lVar27 + 8;
      } while (uVar36 == uVar31);
      uVar31 = uVar31 ^ uVar36;
      uVar36 = 0;
      if (uVar31 != 0) {
        for (; (uVar31 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
        }
      }
      uVar37 = (uVar36 >> 3 & 0x1fffffff) + lVar27;
    }
    else {
      uVar31 = *puVar39 ^ *puVar19;
      uVar36 = 0;
      if (uVar31 != 0) {
        for (; (uVar31 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
        }
      }
      uVar37 = uVar36 >> 3 & 0x1fffffff;
    }
  }
  else {
LAB_00116fab:
    if ((puVar23 < puVar2) && ((int)*puVar19 == (int)*puVar23)) {
      puVar23 = (ulong *)((long)puVar23 + 4);
      puVar19 = (ulong *)((long)puVar19 + 4);
    }
    if ((puVar23 < puVar3) && ((short)*puVar19 == (short)*puVar23)) {
      puVar23 = (ulong *)((long)puVar23 + 2);
      puVar19 = (ulong *)((long)puVar19 + 2);
    }
    if (puVar23 < puVar4) {
      puVar23 = (ulong *)((long)puVar23 + (ulong)((char)*puVar19 == (char)*puVar23));
    }
    uVar37 = (long)puVar23 - (long)puVar39;
  }
  uVar37 = uVar37 + 4;
  UVar30 = 1;
  puVar24 = (ulong *)((long)puVar24 + 1);
  goto LAB_00116ff8;
LAB_00116efb:
  if (uVar37 < 4) {
LAB_00116f01:
    puVar24 = (ulong *)((long)puVar24 + ((long)puVar24 - (long)src >> 8) + 1);
    goto LAB_00117374;
  }
  if (uVar20 == 0) {
    UVar30 = 1;
  }
  else {
    if ((src < puVar24) && (pBVar18 < (BYTE *)((long)puVar24 + (2 - uVar20)))) {
      puVar39 = puVar24;
      while (puVar24 = puVar39,
            *(char *)((long)puVar39 - 1) == *(char *)((long)puVar39 + (1 - uVar20))) {
        puVar24 = (ulong *)((long)puVar39 - 1);
        uVar37 = uVar37 + 1;
        if ((puVar24 <= src) ||
           (pBVar25 = (BYTE *)((long)puVar39 + (1 - uVar20)), puVar39 = puVar24, pBVar25 <= pBVar18)
           ) break;
      }
    }
    UVar30 = (int)uVar20 + 1;
    local_ac = (int)uVar20 - 2;
    local_8c = uVar28;
  }
LAB_00116ff8:
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) {
LAB_00117459:
    __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x2038,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  if (0x20000 < seqStore->maxNbLit) {
LAB_001173fc:
    __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x203a,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  uVar36 = (long)puVar24 - (long)src;
  puVar39 = (ulong *)seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar39 + uVar36)) {
LAB_0011741b:
    __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x203b,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  if (puVar4 < puVar24) {
LAB_0011743a:
    __assert_fail("literals + litLength <= litLimit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x203c,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  if (ilimit_w < puVar24) {
    ZSTD_safecopyLiterals((BYTE *)puVar39,(BYTE *)src,(BYTE *)puVar24,(BYTE *)ilimit_w);
LAB_00117064:
    seqStore->lit = seqStore->lit + uVar36;
    if (0xffff < uVar36) {
      if (seqStore->longLengthID != 0) {
        __assert_fail("seqStorePtr->longLengthID == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x204d,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      seqStore->longLengthID = 1;
      seqStore->longLengthPos =
           (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
    }
  }
  else {
    uVar31 = *(ulong *)((long)src + 8);
    *puVar39 = *src;
    puVar39[1] = uVar31;
    pBVar25 = seqStore->lit;
    if (0x10 < uVar36) {
      lVar22 = (long)(pBVar25 + 0x10) - ((long)src + 0x10);
      if (lVar22 < 8) {
        if (-0x10 < lVar22) {
          __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x1268,
                        "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)")
          ;
        }
      }
      else if (0xffffffffffffffe0 < lVar22 - 0x10U) {
        __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x1270,
                      "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)");
      }
      uVar31 = *(ulong *)((long)src + 0x18);
      *(ulong *)(pBVar25 + 0x10) = *(ulong *)((long)src + 0x10);
      *(ulong *)(pBVar25 + 0x18) = uVar31;
      if (0x20 < (long)uVar36) {
        lVar22 = 0;
        do {
          puVar6 = (undefined8 *)((long)src + lVar22 + 0x20);
          uVar12 = puVar6[1];
          pBVar5 = pBVar25 + lVar22 + 0x20;
          *(undefined8 *)pBVar5 = *puVar6;
          *(undefined8 *)(pBVar5 + 8) = uVar12;
          puVar6 = (undefined8 *)((long)src + lVar22 + 0x30);
          uVar12 = puVar6[1];
          *(undefined8 *)(pBVar5 + 0x10) = *puVar6;
          *(undefined8 *)(pBVar5 + 0x18) = uVar12;
          lVar22 = lVar22 + 0x20;
        } while (pBVar5 + 0x20 < pBVar25 + uVar36);
      }
      goto LAB_00117064;
    }
    seqStore->lit = pBVar25 + uVar36;
  }
  psVar16 = seqStore->sequences;
  psVar16->litLength = (U16)uVar36;
  psVar16->offset = UVar30;
  if (0xffff < uVar37 - 3) {
    if (seqStore->longLengthID != 0) {
LAB_00117497:
      __assert_fail("seqStorePtr->longLengthID == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x2058,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    seqStore->longLengthID = 2;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar16 - (long)seqStore->sequencesStart) >> 3);
  }
  psVar16->matchLength = (U16)(uVar37 - 3);
  psVar16 = psVar16 + 1;
  seqStore->sequences = psVar16;
  src = (void *)((long)puVar24 + uVar37);
  if ((local_8c == 0) || (uVar37 = (ulong)local_8c, puVar32 < src)) {
    uVar31 = (ulong)local_ac;
    puVar24 = (ulong *)src;
    uVar36 = (ulong)local_8c;
  }
  else {
    do {
      uVar20 = uVar37;
      uVar31 = (ulong)local_ac;
      puVar24 = (ulong *)src;
      uVar36 = uVar20;
      if ((int)*src != *(int *)((long)src - uVar20)) break;
      lVar22 = -uVar20;
      puVar24 = (ulong *)((long)src + 4);
      puVar23 = (ulong *)((long)src + lVar22 + 4);
      puVar39 = puVar24;
      if (puVar24 < puVar1) {
        if (*puVar23 == *puVar24) {
          lVar27 = 0;
          do {
            puVar39 = (ulong *)((long)src + lVar27 + 0xc);
            if (puVar1 <= puVar39) {
              puVar23 = (ulong *)((long)src + lVar22 + lVar27 + 0xc);
              puVar39 = (ulong *)((long)src + lVar27 + 0xc);
              goto LAB_001171e8;
            }
            uVar36 = *(ulong *)((long)src + lVar27 + lVar22 + 0xc);
            uVar31 = *puVar39;
            lVar27 = lVar27 + 8;
          } while (uVar36 == uVar31);
          uVar31 = uVar31 ^ uVar36;
          uVar36 = 0;
          if (uVar31 != 0) {
            for (; (uVar31 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
            }
          }
          uVar36 = (uVar36 >> 3 & 0x1fffffff) + lVar27;
        }
        else {
          uVar31 = *puVar24 ^ *puVar23;
          uVar36 = 0;
          if (uVar31 != 0) {
            for (; (uVar31 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
            }
          }
          uVar36 = uVar36 >> 3 & 0x1fffffff;
        }
      }
      else {
LAB_001171e8:
        if ((puVar39 < puVar2) && ((int)*puVar23 == (int)*puVar39)) {
          puVar39 = (ulong *)((long)puVar39 + 4);
          puVar23 = (ulong *)((long)puVar23 + 4);
        }
        if ((puVar39 < puVar3) && ((short)*puVar23 == (short)*puVar39)) {
          puVar39 = (ulong *)((long)puVar39 + 2);
          puVar23 = (ulong *)((long)puVar23 + 2);
        }
        if (puVar39 < puVar4) {
          puVar39 = (ulong *)((long)puVar39 + (ulong)((char)*puVar23 == (char)*puVar39));
        }
        uVar36 = (long)puVar39 - (long)puVar24;
      }
      if (seqStore->maxNbSeq <= (ulong)((long)psVar16 - (long)seqStore->sequencesStart >> 3))
      goto LAB_00117459;
      if (0x20000 < seqStore->maxNbLit) goto LAB_001173fc;
      puVar24 = (ulong *)seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < puVar24) goto LAB_0011741b;
      if (puVar4 < src) goto LAB_0011743a;
      if (ilimit_w < src) {
        ZSTD_safecopyLiterals((BYTE *)puVar24,(BYTE *)src,(BYTE *)src,(BYTE *)ilimit_w);
      }
      else {
        uVar31 = *(ulong *)((long)src + 8);
        *puVar24 = *src;
        puVar24[1] = uVar31;
      }
      psVar16 = seqStore->sequences;
      psVar16->litLength = 0;
      psVar16->offset = 1;
      if (0xffff < uVar36 + 1) {
        if (seqStore->longLengthID != 0) goto LAB_00117497;
        seqStore->longLengthID = 2;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar16 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar16->matchLength = (U16)(uVar36 + 1);
      psVar16 = psVar16 + 1;
      seqStore->sequences = psVar16;
      src = (void *)((long)src + uVar36 + 4);
      uVar31 = uVar20;
      puVar24 = (ulong *)src;
      if (local_ac == 0) {
        uVar36 = 0;
        break;
      }
      uVar36 = (ulong)local_ac;
      uVar37 = (ulong)local_ac;
      local_ac = (uint)uVar20;
    } while (src <= puVar32);
  }
LAB_00117374:
  uVar28 = (uint)uVar36;
  uVar15 = (uint)uVar31;
  if (puVar32 <= puVar24) goto LAB_001173c1;
  goto LAB_0011682a;
}

Assistant:

size_t ZSTD_compressBlock_greedy(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_hashChain, 0, ZSTD_noDict);
}